

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlAttrValueSpec::PrettyPrintAttach
          (GdlAttrValueSpec *this,GrcManager *pcman,ostream *strmOut,bool fXml)

{
  GrcSymbolTableEntry *pGVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  _func_int **pp_Var5;
  long lVar6;
  char *pcVar7;
  GdlExpression *pGVar8;
  int nValue;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->m_fFlattened == true) &&
     ((bVar2 = GrcSymbolTableEntry::IsAttachAtField(this->m_psymName), bVar2 ||
      (bVar2 = GrcSymbolTableEntry::IsAttachWithField(this->m_psymName), bVar2)))) {
    bVar2 = GrcSymbolTableEntry::IsAttachXField(this->m_psymName);
    if (!bVar2) {
      return;
    }
    bVar2 = GrcSymbolTableEntry::IsAttachAtField(this->m_psymName);
    if (bVar2) {
      pcVar7 = "at = ";
      lVar6 = 5;
    }
    else {
      pcVar7 = "with = ";
      lVar6 = 7;
    }
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,pcVar7,lVar6);
    pGVar8 = this->m_pexpValue;
    if (pGVar8 == (GdlExpression *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = __dynamic_cast(pGVar8,&GdlExpression::typeinfo,&GdlLookupExpression::typeinfo,0);
    }
    if (lVar6 != 0) {
      pGVar1 = (GrcSymbolTableEntry *)**(undefined8 **)(*(long *)(lVar6 + 0x38) + 0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"attach","");
      GrcSymbolTableEntry::FullAbbrevOmit(&local_90,pGVar1,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                (strmOut,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                          (int)local_90._M_dataplus._M_p),local_90._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p),
                        local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00116fa6;
    }
    pp_Var5 = pGVar8->_vptr_GdlExpression;
  }
  else {
    bVar2 = GrcSymbolTableEntry::IsAttachOffsetField(this->m_psymName);
    if ((bVar2) &&
       ((iVar3 = (*this->m_pexpValue->_vptr_GdlExpression[7])(this->m_pexpValue,&local_90,0),
        (char)iVar3 != '\0' && ((int)local_90._M_dataplus._M_p == 0)))) {
      return;
    }
    pGVar1 = this->m_psymName;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"attach","");
    GrcSymbolTableEntry::FullAbbrevOmit(&local_90,pGVar1,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              (strmOut,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                        (int)local_90._M_dataplus._M_p),local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p),
                      local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
    GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_90,this->m_psymOperator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (strmOut,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                 (int)local_90._M_dataplus._M_p),
                        local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p),
                      local_90.field_2._M_allocated_capacity + 1);
    }
    pGVar8 = this->m_pexpValue;
    pp_Var5 = pGVar8->_vptr_GdlExpression;
  }
  (*pp_Var5[0x1d])(pGVar8,pcman,strmOut,fXml,0);
LAB_00116fa6:
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"; ",2);
  return;
}

Assistant:

void GdlAttrValueSpec::PrettyPrintAttach(GrcManager * pcman, std::ostream & strmOut, bool fXml)
{
	if (m_fFlattened
		&& (m_psymName->IsAttachAtField() || m_psymName->IsAttachWithField()))
	{
		// A single statement like "attach.at = apt" has been translated into
		// "attach.at.x = apt.x, attach.at.y = apt.y, attach.at.xoffset = apt.xoffset,
		// attach.at.yoffset = apt.yoffset". Just print out one of these, say, the x.
		if (m_psymName->IsAttachXField())
		{
			if (m_psymName->IsAttachAtField())
				strmOut << "at = ";
			else
				strmOut << "with = ";
			GdlLookupExpression * pexpLookup = dynamic_cast<GdlLookupExpression *>(m_pexpValue);
			if (pexpLookup)
			{
				Symbol psym = pexpLookup->Name()->ParentSymbol();
				strmOut << psym->FullAbbrevOmit("attach");
			}
			else
				// strange...
				m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
			strmOut << "; ";
		}
		return;
	}
	
	if (m_psymName->IsAttachOffsetField())
	{
		int nValue;
		if (m_pexpValue->ResolveToInteger(&nValue, false) && nValue == 0)
			// Don't bother putting out something like attach.at.xoffset = 0.
			return;
	}

	strmOut << m_psymName->FullAbbrevOmit("attach");
	strmOut << " " << m_psymOperator->FullAbbrev() << " ";
	m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
	strmOut << "; ";
}